

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

void duckdb::QuantileListOperation<duckdb::string_t,true>::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>>
               (QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *state,
               list_entry_t *target,AggregateFinalizeData *finalize_data)

{
  AggregateInputData *this;
  data_ptr_t pdVar1;
  pointer psVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  Vector *pVVar5;
  idx_t iVar6;
  reference q_00;
  undefined8 uVar7;
  FunctionData *pFVar8;
  unsigned_long *q;
  _func_int **pp_Var9;
  idx_t iVar10;
  uint64_t uVar11;
  idx_t n;
  RESULT_TYPE RVar12;
  string_t sVar13;
  QuantileDirect<duckdb::string_t> local_89;
  list_entry_t *local_88;
  FunctionData *local_80;
  AggregateFinalizeData *local_78;
  pointer local_70;
  Vector *local_68;
  vector<duckdb::QuantileValue,_true> *local_60;
  Interpolator<true> local_58;
  
  if ((state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
      super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
      super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    AggregateFinalizeData::ReturnNull(finalize_data);
    return;
  }
  this = finalize_data->input;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
  pFVar8 = (this->bind_data).ptr;
  pVVar5 = ListVector::GetEntry(finalize_data->result);
  iVar6 = ListVector::GetListSize(finalize_data->result);
  ListVector::Reserve(finalize_data->result,
                      ((long)pFVar8[2]._vptr_FunctionData - (long)pFVar8[1]._vptr_FunctionData >> 3)
                      * 0x4ec4ec4ec4ec4ec5 + iVar6);
  pdVar1 = pVVar5->data;
  psVar2 = (state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
           super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  target->offset = iVar6;
  pp_Var9 = pFVar8[4]._vptr_FunctionData;
  pp_Var3 = pFVar8[5]._vptr_FunctionData;
  local_88 = target;
  if (pp_Var9 != pp_Var3) {
    local_60 = (vector<duckdb::QuantileValue,_true> *)(pFVar8 + 1);
    iVar10 = 0;
    local_80 = pFVar8;
    local_78 = finalize_data;
    local_70 = psVar2;
    local_68 = pVVar5;
    do {
      q_00 = vector<duckdb::QuantileValue,_true>::operator[](local_60,(size_type)*pp_Var9);
      n = (long)(state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
                super__Vector_impl_data._M_start >> 4;
      local_58.desc = *(bool *)&local_80[7]._vptr_FunctionData;
      uVar7 = CONCAT71((int7)((ulong)local_80 >> 8),local_58.desc);
      local_58.FRN = Interpolator<true>::Index(q_00,n);
      local_58.CRN = local_58.FRN;
      local_58.begin = iVar10;
      local_58.end = n;
      RVar12 = Interpolator<true>::
               InterpolateInternal<duckdb::string_t,duckdb::QuantileDirect<duckdb::string_t>>
                         (&local_58,local_70,&local_89);
      sVar13.value._0_8_ = RVar12.value._8_8_;
      sVar13.value.pointer.ptr = (char *)uVar7;
      sVar13 = StringVector::AddStringOrBlob((StringVector *)local_68,RVar12.value._0_8_,sVar13);
      p_Var4 = *pp_Var9;
      *(long *)(pdVar1 + (long)p_Var4 * 0x10 + iVar6 * 0x10) = sVar13.value._0_8_;
      *(long *)(pdVar1 + (long)p_Var4 * 0x10 + iVar6 * 0x10 + 8) = sVar13.value._8_8_;
      pp_Var9 = pp_Var9 + 1;
      iVar10 = local_58.FRN;
    } while (pp_Var9 != pp_Var3);
    iVar6 = local_88->offset;
    pFVar8 = local_80;
    finalize_data = local_78;
  }
  uVar11 = ((long)pFVar8[2]._vptr_FunctionData - (long)pFVar8[1]._vptr_FunctionData >> 3) *
           0x4ec4ec4ec4ec4ec5;
  local_88->length = uVar11;
  ListVector::SetListSize(finalize_data->result,uVar11 + iVar6);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v.data();
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<DISCRETE> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			rdata[ridx + q] = interp.template Operation<typename STATE::InputType, CHILD_TYPE>(v_t, result);
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}